

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerMessageDeflate.h
# Opt level: O3

string_view __thiscall
uWS::DeflationStream::deflate
          (DeflationStream *this,ZlibContext *zlibContext,string_view raw,bool reset)

{
  int iVar1;
  ulong uVar2;
  string_view sVar3;
  
  (zlibContext->dynamicDeflationBuffer)._M_string_length = 0;
  *(zlibContext->dynamicDeflationBuffer)._M_dataplus._M_p = '\0';
  (this->deflationStream).next_in = (Bytef *)raw._M_str;
  (this->deflationStream).avail_in = (uInt)raw._M_len;
  (this->deflationStream).next_out = (Bytef *)zlibContext->deflationBuffer;
  (this->deflationStream).avail_out = 0x4000;
  while( true ) {
    iVar1 = ::deflate(this,2);
    if (iVar1 != 0 || (this->deflationStream).avail_out != 0) break;
    std::__cxx11::string::append((char *)zlibContext,(ulong)zlibContext->deflationBuffer);
    (this->deflationStream).next_out = (Bytef *)zlibContext->deflationBuffer;
    (this->deflationStream).avail_out = 0x4000;
  }
  if (reset) {
    deflateReset(this);
  }
  if ((zlibContext->dynamicDeflationBuffer)._M_string_length == 0) {
    zlibContext = (ZlibContext *)&zlibContext->deflationBuffer;
    uVar2 = (ulong)(0x3ffc - (this->deflationStream).avail_out);
  }
  else {
    std::__cxx11::string::append((char *)zlibContext,(ulong)zlibContext->deflationBuffer);
    uVar2 = (zlibContext->dynamicDeflationBuffer)._M_string_length - 4;
  }
  sVar3._M_str = (zlibContext->dynamicDeflationBuffer)._M_dataplus._M_p;
  sVar3._M_len = uVar2;
  return sVar3;
}

Assistant:

std::string_view deflate(ZlibContext *zlibContext, std::string_view raw, bool reset) {
        /* Odd place to clear this one, fix */
        zlibContext->dynamicDeflationBuffer.clear();

        deflationStream.next_in = (Bytef *) raw.data();
        deflationStream.avail_in = (unsigned int) raw.length();

        /* This buffer size has to be at least 6 bytes for Z_SYNC_FLUSH to work */
        const int DEFLATE_OUTPUT_CHUNK = LARGE_BUFFER_SIZE;

        int err;
        do {
            deflationStream.next_out = (Bytef *) zlibContext->deflationBuffer;
            deflationStream.avail_out = DEFLATE_OUTPUT_CHUNK;

            err = ::deflate(&deflationStream, Z_SYNC_FLUSH);
            if (Z_OK == err && deflationStream.avail_out == 0) {
                zlibContext->dynamicDeflationBuffer.append(zlibContext->deflationBuffer, DEFLATE_OUTPUT_CHUNK - deflationStream.avail_out);
                continue;
            } else {
                break;
            }
        } while (true);

        /* This must not change avail_out */
        if (reset) {
            deflateReset(&deflationStream);
        }

        if (zlibContext->dynamicDeflationBuffer.length()) {
            zlibContext->dynamicDeflationBuffer.append(zlibContext->deflationBuffer, DEFLATE_OUTPUT_CHUNK - deflationStream.avail_out);

            return {(char *) zlibContext->dynamicDeflationBuffer.data(), zlibContext->dynamicDeflationBuffer.length() - 4};
        }

        return {
            zlibContext->deflationBuffer,
            DEFLATE_OUTPUT_CHUNK - deflationStream.avail_out - 4
        };
    }